

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void line_attempt_1(int x0,int y0,int x1,int y1,TGAImage *image,TGAColor color)

{
  float fVar1;
  TGAColor local_18;
  
  local_18.bgra = color.bgra;
  local_18.bytespp = color.bytespp;
  fVar1 = 0.0;
  do {
    TGAImage::set(image,(long)(int)((float)(x1 - x0) * fVar1 + (float)x0),
                  (long)(int)((float)(y1 - y0) * fVar1 + (float)y0),&local_18);
    fVar1 = fVar1 + 0.01;
  } while (fVar1 < 1.0);
  return;
}

Assistant:

void line_attempt_1(int x0, int y0, int x1, int y1, TGAImage &image, TGAColor color)
{
    for (float t = 0.f; t < 1.f; t += .01f) {
        int x = static_cast<int>(static_cast<float>(x0) + static_cast<float>(x1 - x0) * t);
        int y = static_cast<int>(static_cast<float>(y0) + static_cast<float>(y1 - y0) * t);
        image.set(x, y, color);
    }
}